

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_4.hpp
# Opt level: O1

unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::draft4::
schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::make_maximum_validator_4
          (schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent)

{
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *pkVar1;
  bool bVar2;
  exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *this_00;
  runtime_error *this_01;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *in_R8;
  const_object_iterator cVar3;
  string message;
  uri schema_location;
  undefined1 local_100 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_d0;
  uri local_c0;
  
  pkVar1 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            *)(local_100 + 0x10);
  local_100._0_8_ = pkVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"maximum","");
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  make_schema_location
            (&local_c0,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)sch,(string *)local_100);
  if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
       *)local_100._0_8_ != pkVar1) {
    operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
  }
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(parent);
  if (!bVar2) {
    local_100._0_8_ = pkVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"maximum must be a number value","");
    this_01 = (runtime_error *)__cxa_allocate_exception(0x18);
    *(undefined ***)(this_01 + 0x10) = &PTR__json_exception_00b58738;
    std::runtime_error::runtime_error(this_01,(string *)local_100);
    *(undefined8 *)this_01 = 0xb6b4e0;
    *(undefined8 *)(this_01 + 0x10) = 0xb6b518;
    __cxa_throw(this_01,&schema_error::typeinfo,schema_error::~schema_error);
  }
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_R8);
  if (bVar2) {
    local_100._0_8_ = &DAT_00000010;
    local_100._8_8_ = "exclusiveMaximum";
    cVar3 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                      (in_R8,(string_view_type *)local_100);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              ((const_object_range_type *)local_100,in_R8);
    if ((((undefined1  [16])cVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((local_100[0x18] & 1) == 0)) {
      bVar2 = cVar3.has_value_ == (bool)local_100[0x18];
    }
    else {
      bVar2 = cVar3.it_._M_current._M_current ==
              (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *)local_100._16_8_;
    }
    if (!bVar2) {
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool
                        (&(cVar3.it_._M_current._M_current)->value_);
      if (bVar2) {
        local_e0._M_allocated_capacity = (size_type)&local_d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"maximum","");
        compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::get_custom_message
                  ((string *)local_100,
                   (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)sch,(string *)&local_e0);
        this_00 = (exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)operator_new(0x118);
        exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::exclusive_maximum_validator
                  (this_00,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_R8
                   ,&local_c0,(string *)local_100,parent);
        goto LAB_004fc744;
      }
    }
  }
  local_e0._M_allocated_capacity = (size_type)&local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"maximum","");
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  get_custom_message((string *)local_100,
                     (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)sch,(string *)&local_e0);
  this_00 = (exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)operator_new(0x118);
  maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  maximum_validator((maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)this_00,
                    (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_R8,
                    &local_c0,(string *)local_100,parent);
LAB_004fc744:
  (this->
  super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  )._vptr_schema_validator_factory_base = (_func_int **)this_00;
  if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
       *)local_100._0_8_ !=
      (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
       *)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
  }
  if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
       *)local_e0._M_allocated_capacity != &local_d0) {
    operator_delete((void *)local_e0._M_allocated_capacity,local_d0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.uri_string_._M_dataplus._M_p != &local_c0.uri_string_.field_2) {
    operator_delete(local_c0.uri_string_._M_dataplus._M_p,
                    local_c0.uri_string_.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<keyword_validator<Json>> make_maximum_validator_4(const compilation_context<Json>& context, 
            const Json& sch, const Json& parent)
        {
            uri schema_location = context.make_schema_location("maximum");
            if (!sch.is_number())
            {
                const std::string message("maximum must be a number value");
                JSONCONS_THROW(schema_error(message));
            }
            
            bool is_exclusive = false;

            if (parent.is_object())
            {
                auto it = parent.find("exclusiveMaximum");
                if (it != parent.object_range().end())
                {
                    is_exclusive = (*it).value().as_bool();
                }
            }
            if (is_exclusive)
            {
                return jsoncons::make_unique<exclusive_maximum_validator<Json>>(parent, schema_location, 
                    context.get_custom_message("maximum"), sch);
            }
            else
            {
                return jsoncons::make_unique<maximum_validator<Json>>(parent, schema_location,
                    context.get_custom_message("maximum"), sch);
            }
        }